

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void attachFunc(sqlite3_context *context,int NotUsed,sqlite3_value **argv)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  sqlite3 *db;
  Db *pDVar4;
  Pager *pPVar5;
  Btree *pBVar6;
  char *pcVar7;
  Btree *pBVar8;
  Schema *pSVar9;
  u8 uVar10;
  undefined6 uVar11;
  u8 uVar12;
  u8 uVar13;
  undefined6 uVar14;
  Btree **ppBVar15;
  int iVar16;
  int iVar17;
  char *zUri;
  char *pcVar18;
  Db *pDVar19;
  Schema *pSVar20;
  long lVar21;
  long lVar22;
  char *pcVar23;
  long lVar24;
  char *zErrDyn;
  uint flags;
  char *zPath;
  char *zErr;
  sqlite3_vfs *pVfs;
  char *local_60;
  uint local_54;
  Btree **local_50;
  char *local_48;
  char *local_40;
  sqlite3_vfs *local_38;
  
  db = context->pOut->db;
  iVar17 = 0;
  local_48 = (char *)0x0;
  local_40 = (char *)0x0;
  local_60 = (char *)0x0;
  zUri = (char *)sqlite3ValueText(*argv,'\x01');
  pcVar18 = (char *)sqlite3ValueText(argv[1],'\x01');
  if (zUri == (char *)0x0) {
    zUri = "";
  }
  if (pcVar18 == (char *)0x0) {
    pcVar18 = "";
  }
  if (db->nDb < db->aLimit[7] + 2) {
    lVar22 = (long)db->nDb;
    if (0 < lVar22) {
      lVar21 = 0;
LAB_001baa0e:
      lVar24 = 0;
      do {
        bVar2 = db->aDb[lVar21].zDbSName[lVar24];
        bVar3 = pcVar18[lVar24];
        if (bVar2 == bVar3) {
          if ((ulong)bVar2 == 0) goto LAB_001baa42;
        }
        else if (""[bVar2] != ""[bVar3]) goto LAB_001baa42;
        lVar24 = lVar24 + 1;
      } while( true );
    }
LAB_001baa4f:
    if (db->aDb == db->aDbStatic) {
      pDVar19 = (Db *)sqlite3DbMallocRawNN(db,0x60);
      if (pDVar19 == (Db *)0x0) {
        return;
      }
      pDVar4 = db->aDb;
      pcVar23 = pDVar4->zDbSName;
      pBVar6 = pDVar4->pBt;
      uVar12 = pDVar4->safety_level;
      uVar13 = pDVar4->bSyncSet;
      uVar14 = *(undefined6 *)&pDVar4->field_0x12;
      pSVar20 = pDVar4->pSchema;
      pcVar7 = pDVar4[1].zDbSName;
      pBVar8 = pDVar4[1].pBt;
      uVar10 = pDVar4[1].bSyncSet;
      uVar11 = *(undefined6 *)&pDVar4[1].field_0x12;
      pSVar9 = pDVar4[1].pSchema;
      pDVar19[1].safety_level = pDVar4[1].safety_level;
      pDVar19[1].bSyncSet = uVar10;
      *(undefined6 *)&pDVar19[1].field_0x12 = uVar11;
      pDVar19[1].pSchema = pSVar9;
      pDVar19[1].zDbSName = pcVar7;
      pDVar19[1].pBt = pBVar8;
      pDVar19->safety_level = uVar12;
      pDVar19->bSyncSet = uVar13;
      *(undefined6 *)&pDVar19->field_0x12 = uVar14;
      pDVar19->pSchema = pSVar20;
      pDVar19->zDbSName = pcVar23;
      pDVar19->pBt = pBVar6;
    }
    else {
      pDVar19 = (Db *)sqlite3DbRealloc(db,db->aDb,lVar22 * 0x20 + 0x20);
      if (pDVar19 == (Db *)0x0) {
        return;
      }
    }
    db->aDb = pDVar19;
    iVar17 = db->nDb;
    pDVar4 = pDVar19 + iVar17;
    pDVar4->safety_level = '\0';
    pDVar4->bSyncSet = '\0';
    *(undefined6 *)&pDVar4->field_0x12 = 0;
    *(Schema **)(&pDVar4->safety_level + 8) = (Schema *)0x0;
    pDVar19[iVar17].zDbSName = (char *)0x0;
    pDVar19[iVar17].pBt = (Btree *)0x0;
    local_54 = db->openFlags;
    iVar16 = sqlite3ParseUri(db->pVfs->zName,zUri,&local_54,&local_38,&local_48,&local_40);
    if (iVar16 != 0) {
      if (iVar16 == 7) {
        sqlite3OomFault(db);
      }
      pcVar18 = local_40;
      context->isError = 1;
      sqlite3VdbeMemSetStr
                (context->pOut,local_40,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      sqlite3_free(pcVar18);
      return;
    }
    pDVar19 = pDVar19 + iVar17;
    local_54 = local_54 | 0x100;
    local_50 = &pDVar19->pBt;
    iVar17 = sqlite3BtreeOpen(local_38,local_48,db,local_50,0,local_54);
    db->nDb = db->nDb + 1;
    pcVar18 = sqlite3DbStrDup(db,pcVar18);
    pDVar19->zDbSName = pcVar18;
    db->noSharedCache = '\0';
    if (iVar17 == 0) {
      pSVar20 = sqlite3SchemaGet(db,pDVar19->pBt);
      ppBVar15 = local_50;
      pDVar19->pSchema = pSVar20;
      if (pSVar20 == (Schema *)0x0) {
        iVar17 = 7;
      }
      else {
        iVar17 = 0;
        if ((pSVar20->file_format != '\0') && (pSVar20->enc != db->enc)) {
          local_60 = sqlite3MPrintf(db,
                                    "attached databases must use the same text encoding as main database"
                                   );
          iVar17 = 1;
        }
      }
      sqlite3BtreeEnter(*ppBVar15);
      pBVar6 = *ppBVar15;
      pPVar5 = pBVar6->pBt->pPager;
      if (pPVar5->tempFile == '\0') {
        if ((pPVar5->pWal == (Wal *)0x0) || (pPVar5->pWal->exclusiveMode != '\x02')) {
          pPVar5->exclusiveMode = db->dfltLockMode;
        }
      }
      iVar16 = sqlite3BtreeSecureDelete(db->aDb->pBt,-1);
      sqlite3BtreeSecureDelete(pBVar6,iVar16);
      ppBVar15 = local_50;
      sqlite3BtreeSetPagerFlags(*local_50,(uint)db->flags & 0x38 | 3);
      pBVar6 = *ppBVar15;
      if (pBVar6->sharable != '\0') {
        piVar1 = &pBVar6->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar6);
        }
      }
    }
    else if (iVar17 == 0x13) {
      local_60 = sqlite3MPrintf(db,"database is already attached");
      iVar17 = 1;
    }
    pDVar19->safety_level = '\x03';
    if ((iVar17 == 0) && (iVar17 = 7, pDVar19->zDbSName != (char *)0x0)) {
      iVar17 = 0;
    }
    sqlite3_free(local_48);
    if (iVar17 == 0) {
      if (db->noSharedCache == '\0') {
        btreeEnterAll(db);
      }
      (db->init).iDb = '\0';
      *(byte *)&db->mDbFlags = (byte)db->mDbFlags & 0xef;
      iVar17 = sqlite3Init(db,&local_60);
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
      }
    }
    if (iVar17 == 0) {
      return;
    }
    lVar22 = (long)db->nDb + -1;
    pBVar6 = db->aDb[lVar22].pBt;
    if (pBVar6 != (Btree *)0x0) {
      sqlite3BtreeClose(pBVar6);
      pDVar19 = db->aDb;
      pDVar19[lVar22].pBt = (Btree *)0x0;
      pDVar19[lVar22].pSchema = (Schema *)0x0;
    }
    sqlite3ResetAllSchemasOfConnection(db);
    db->nDb = (int)lVar22;
    if ((iVar17 == 0xc0a) || (iVar17 == 7)) {
      sqlite3OomFault(db);
      if (local_60 != (char *)0x0) {
        sqlite3DbFreeNN(db,local_60);
      }
      local_60 = sqlite3MPrintf(db,"out of memory");
    }
    else if (local_60 == (char *)0x0) {
      pcVar23 = "unable to open database: %s";
      pcVar18 = zUri;
LAB_001baaa4:
      local_60 = sqlite3MPrintf(db,pcVar23,pcVar18);
    }
  }
  else {
    local_60 = sqlite3MPrintf(db,"too many attached databases - max %d");
  }
  if (local_60 != (char *)0x0) {
    context->isError = 1;
    sqlite3VdbeMemSetStr(context->pOut,local_60,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
    ;
    if (local_60 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_60);
    }
  }
  if (iVar17 != 0) {
    sqlite3_result_error_code(context,iVar17);
  }
  return;
LAB_001baa42:
  if (bVar2 == bVar3) {
    pcVar23 = "database %s is already in use";
    iVar17 = 0;
    goto LAB_001baaa4;
  }
  lVar21 = lVar21 + 1;
  if (lVar21 == lVar22) goto LAB_001baa4f;
  goto LAB_001baa0e;
}

Assistant:

static void attachFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **argv
){
  int i;
  int rc = 0;
  sqlite3 *db = sqlite3_context_db_handle(context);
  const char *zName;
  const char *zFile;
  char *zPath = 0;
  char *zErr = 0;
  unsigned int flags;
  Db *aNew;                 /* New array of Db pointers */
  Db *pNew;                 /* Db object for the newly attached database */
  char *zErrDyn = 0;
  sqlite3_vfs *pVfs;

  UNUSED_PARAMETER(NotUsed);
  zFile = (const char *)sqlite3_value_text(argv[0]);
  zName = (const char *)sqlite3_value_text(argv[1]);
  if( zFile==0 ) zFile = "";
  if( zName==0 ) zName = "";

#ifdef SQLITE_ENABLE_DESERIALIZE
# define REOPEN_AS_MEMDB(db)  (db->init.reopenMemdb)
#else
# define REOPEN_AS_MEMDB(db)  (0)
#endif

  if( REOPEN_AS_MEMDB(db) ){
    /* This is not a real ATTACH.  Instead, this routine is being called
    ** from sqlite3_deserialize() to close database db->init.iDb and
    ** reopen it as a MemDB */
    pVfs = sqlite3_vfs_find("memdb");
    if( pVfs==0 ) return;
    pNew = &db->aDb[db->init.iDb];
    if( pNew->pBt ) sqlite3BtreeClose(pNew->pBt);
    pNew->pBt = 0;
    pNew->pSchema = 0;
    rc = sqlite3BtreeOpen(pVfs, "x\0", db, &pNew->pBt, 0, SQLITE_OPEN_MAIN_DB);
  }else{
    /* This is a real ATTACH
    **
    ** Check for the following errors:
    **
    **     * Too many attached databases,
    **     * Transaction currently open
    **     * Specified database name already being used.
    */
    if( db->nDb>=db->aLimit[SQLITE_LIMIT_ATTACHED]+2 ){
      zErrDyn = sqlite3MPrintf(db, "too many attached databases - max %d", 
        db->aLimit[SQLITE_LIMIT_ATTACHED]
      );
      goto attach_error;
    }
    for(i=0; i<db->nDb; i++){
      char *z = db->aDb[i].zDbSName;
      assert( z && zName );
      if( sqlite3StrICmp(z, zName)==0 ){
        zErrDyn = sqlite3MPrintf(db, "database %s is already in use", zName);
        goto attach_error;
      }
    }
  
    /* Allocate the new entry in the db->aDb[] array and initialize the schema
    ** hash tables.
    */
    if( db->aDb==db->aDbStatic ){
      aNew = sqlite3DbMallocRawNN(db, sizeof(db->aDb[0])*3 );
      if( aNew==0 ) return;
      memcpy(aNew, db->aDb, sizeof(db->aDb[0])*2);
    }else{
      aNew = sqlite3DbRealloc(db, db->aDb, sizeof(db->aDb[0])*(db->nDb+1) );
      if( aNew==0 ) return;
    }
    db->aDb = aNew;
    pNew = &db->aDb[db->nDb];
    memset(pNew, 0, sizeof(*pNew));
  
    /* Open the database file. If the btree is successfully opened, use
    ** it to obtain the database schema. At this point the schema may
    ** or may not be initialized.
    */
    flags = db->openFlags;
    rc = sqlite3ParseUri(db->pVfs->zName, zFile, &flags, &pVfs, &zPath, &zErr);
    if( rc!=SQLITE_OK ){
      if( rc==SQLITE_NOMEM ) sqlite3OomFault(db);
      sqlite3_result_error(context, zErr, -1);
      sqlite3_free(zErr);
      return;
    }
    assert( pVfs );
    flags |= SQLITE_OPEN_MAIN_DB;
    rc = sqlite3BtreeOpen(pVfs, zPath, db, &pNew->pBt, 0, flags);
    db->nDb++;
    pNew->zDbSName = sqlite3DbStrDup(db, zName);
  }
  db->noSharedCache = 0;
  if( rc==SQLITE_CONSTRAINT ){
    rc = SQLITE_ERROR;
    zErrDyn = sqlite3MPrintf(db, "database is already attached");
  }else if( rc==SQLITE_OK ){
    Pager *pPager;
    pNew->pSchema = sqlite3SchemaGet(db, pNew->pBt);
    if( !pNew->pSchema ){
      rc = SQLITE_NOMEM_BKPT;
    }else if( pNew->pSchema->file_format && pNew->pSchema->enc!=ENC(db) ){
      zErrDyn = sqlite3MPrintf(db, 
        "attached databases must use the same text encoding as main database");
      rc = SQLITE_ERROR;
    }
    sqlite3BtreeEnter(pNew->pBt);
    pPager = sqlite3BtreePager(pNew->pBt);
    sqlite3PagerLockingMode(pPager, db->dfltLockMode);
    sqlite3BtreeSecureDelete(pNew->pBt,
                             sqlite3BtreeSecureDelete(db->aDb[0].pBt,-1) );
#ifndef SQLITE_OMIT_PAGER_PRAGMAS
    sqlite3BtreeSetPagerFlags(pNew->pBt,
                      PAGER_SYNCHRONOUS_FULL | (db->flags & PAGER_FLAGS_MASK));
#endif
    sqlite3BtreeLeave(pNew->pBt);
  }
  pNew->safety_level = SQLITE_DEFAULT_SYNCHRONOUS+1;
  if( rc==SQLITE_OK && pNew->zDbSName==0 ){
    rc = SQLITE_NOMEM_BKPT;
  }


#ifdef SQLITE_HAS_CODEC
  if( rc==SQLITE_OK ){
    extern int sqlite3CodecAttach(sqlite3*, int, const void*, int);
    extern void sqlite3CodecGetKey(sqlite3*, int, void**, int*);
    int nKey;
    char *zKey;
    int t = sqlite3_value_type(argv[2]);
    switch( t ){
      case SQLITE_INTEGER:
      case SQLITE_FLOAT:
        zErrDyn = sqlite3DbStrDup(db, "Invalid key value");
        rc = SQLITE_ERROR;
        break;
        
      case SQLITE_TEXT:
      case SQLITE_BLOB:
        nKey = sqlite3_value_bytes(argv[2]);
        zKey = (char *)sqlite3_value_blob(argv[2]);
        rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
        break;

      case SQLITE_NULL:
        /* No key specified.  Use the key from URI filename, or if none,
        ** use the key from the main database. */
        if( sqlite3CodecQueryParameters(db, zName, zPath)==0 ){
          sqlite3CodecGetKey(db, 0, (void**)&zKey, &nKey);
          if( nKey || sqlite3BtreeGetOptimalReserve(db->aDb[0].pBt)>0 ){
            rc = sqlite3CodecAttach(db, db->nDb-1, zKey, nKey);
          }
        }
        break;
    }
  }
#endif
  sqlite3_free( zPath );

  /* If the file was opened successfully, read the schema for the new database.
  ** If this fails, or if opening the file failed, then close the file and 
  ** remove the entry from the db->aDb[] array. i.e. put everything back the
  ** way we found it.
  */
  if( rc==SQLITE_OK ){
    sqlite3BtreeEnterAll(db);
    db->init.iDb = 0;
    db->mDbFlags &= ~(DBFLAG_SchemaKnownOk);
    if( !REOPEN_AS_MEMDB(db) ){
      rc = sqlite3Init(db, &zErrDyn);
    }
    sqlite3BtreeLeaveAll(db);
    assert( zErrDyn==0 || rc!=SQLITE_OK );
  }
#ifdef SQLITE_USER_AUTHENTICATION
  if( rc==SQLITE_OK && !REOPEN_AS_MEMDB(db) ){
    u8 newAuth = 0;
    rc = sqlite3UserAuthCheckLogin(db, zName, &newAuth);
    if( newAuth<db->auth.authLevel ){
      rc = SQLITE_AUTH_USER;
    }
  }
#endif
  if( rc ){
    if( !REOPEN_AS_MEMDB(db) ){
      int iDb = db->nDb - 1;
      assert( iDb>=2 );
      if( db->aDb[iDb].pBt ){
        sqlite3BtreeClose(db->aDb[iDb].pBt);
        db->aDb[iDb].pBt = 0;
        db->aDb[iDb].pSchema = 0;
      }
      sqlite3ResetAllSchemasOfConnection(db);
      db->nDb = iDb;
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        sqlite3DbFree(db, zErrDyn);
        zErrDyn = sqlite3MPrintf(db, "out of memory");
      }else if( zErrDyn==0 ){
        zErrDyn = sqlite3MPrintf(db, "unable to open database: %s", zFile);
      }
    }
    goto attach_error;
  }
  
  return;

attach_error:
  /* Return an error if we get here */
  if( zErrDyn ){
    sqlite3_result_error(context, zErrDyn, -1);
    sqlite3DbFree(db, zErrDyn);
  }
  if( rc ) sqlite3_result_error_code(context, rc);
}